

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::IsTrue
          (cmConditionEvaluator *this,
          vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args,
          string *errorString,MessageType *status)

{
  code *pcVar1;
  value_type vVar2;
  bool bVar3;
  byte bVar4;
  const_iterator pvVar5;
  size_type sVar6;
  reference newArg;
  long *plVar7;
  code *local_128;
  ulong local_f8;
  size_type beginSize;
  bool levelResult;
  value_type fn;
  const_iterator __end1;
  const_iterator __begin1;
  array<bool_(cmConditionEvaluator::*)(cmConditionEvaluator::cmArgumentList_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MessageType_&),_5UL>
  *__range1;
  array<bool_(cmConditionEvaluator::*)(cmConditionEvaluator::cmArgumentList_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MessageType_&),_5UL>
  handlers;
  allocator<cmExpandedCommandArgument> local_59;
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  local_58;
  __normal_iterator<const_cmExpandedCommandArgument_*,_std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>_>
  local_50;
  undefined1 local_48 [8];
  cmArgumentList newArgs;
  MessageType *status_local;
  string *errorString_local;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> *args_local;
  cmConditionEvaluator *this_local;
  
  newArgs.super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
  super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>._M_impl.
  _M_node._M_size = (size_t)status;
  std::__cxx11::string::clear();
  bVar3 = std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::empty
                    (args);
  if (bVar3) {
    this_local._7_1_ = false;
  }
  else {
    local_50._M_current =
         (cmExpandedCommandArgument *)
         std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::begin
                   (args);
    local_58._M_current =
         (cmExpandedCommandArgument *)
         std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::end
                   (args);
    std::allocator<cmExpandedCommandArgument>::allocator(&local_59);
    cmArgumentList::
    list<__gnu_cxx::__normal_iterator<cmExpandedCommandArgument_const*,std::vector<cmExpandedCommandArgument,std::allocator<cmExpandedCommandArgument>>>,void>
              ((cmArgumentList *)local_48,local_50,local_58,&local_59);
    std::allocator<cmExpandedCommandArgument>::~allocator(&local_59);
    memset(&__range1,0,0x50);
    __range1 = (array<bool_(cmConditionEvaluator::*)(cmConditionEvaluator::cmArgumentList_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MessageType_&),_5UL>
                *)HandleLevel0;
    handlers._M_elems[1] = (value_type)HandleLevel1;
    handlers._M_elems[3] = (value_type)HandleLevel2;
    handlers._40_8_ = HandleLevel3;
    handlers._56_8_ = HandleLevel4;
    __end1 = std::
             array<bool_(cmConditionEvaluator::*)(cmConditionEvaluator::cmArgumentList_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MessageType_&),_5UL>
             ::begin((array<bool_(cmConditionEvaluator::*)(cmConditionEvaluator::cmArgumentList_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MessageType_&),_5UL>
                      *)&__range1);
    pvVar5 = std::
             array<bool_(cmConditionEvaluator::*)(cmConditionEvaluator::cmArgumentList_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MessageType_&),_5UL>
             ::end((array<bool_(cmConditionEvaluator::*)(cmConditionEvaluator::cmArgumentList_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_MessageType_&),_5UL>
                    *)&__range1);
    for (; __end1 != pvVar5; __end1 = __end1 + 2) {
      pcVar1 = (code *)*__end1;
      vVar2 = __end1[1];
      local_f8 = std::__cxx11::
                 list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::size
                           ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             *)local_48);
      while( true ) {
        plVar7 = (long *)((long)&this->Makefile + vVar2);
        local_128 = pcVar1;
        if (((ulong)pcVar1 & 1) != 0) {
          local_128 = *(code **)(pcVar1 + *plVar7 + -1);
        }
        bVar4 = (*local_128)(plVar7,local_48,errorString,
                             newArgs.
                             super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             .
                             super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                             ._M_impl._M_node._M_size);
        bVar3 = false;
        if ((bVar4 & 1) != 0) {
          sVar6 = std::__cxx11::
                  list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::size
                            ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                              *)local_48);
          bVar3 = sVar6 < local_f8;
        }
        if (!bVar3) break;
        local_f8 = std::__cxx11::
                   list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::size
                             ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                               *)local_48);
      }
      if ((bVar4 & 1) == 0) {
        this_local._7_1_ = false;
        goto LAB_0090bdfb;
      }
    }
    sVar6 = std::__cxx11::
            list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::size
                      ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                        *)local_48);
    if (sVar6 == 1) {
      newArg = std::__cxx11::
               list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::front
                         ((list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                           *)local_48);
      this_local._7_1_ =
           GetBooleanValueWithAutoDereference
                     (this,newArg,errorString,
                      (MessageType *)
                      newArgs.
                      super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      .
                      super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
                      ._M_impl._M_node._M_size,true);
    }
    else {
      std::__cxx11::string::operator=((string *)errorString,"Unknown arguments specified");
      *(undefined4 *)
       newArgs.super_list<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
       super__List_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>.
       _M_impl._M_node._M_size = 2;
      this_local._7_1_ = false;
    }
LAB_0090bdfb:
    cmArgumentList::~cmArgumentList((cmArgumentList *)local_48);
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::IsTrue(
  const std::vector<cmExpandedCommandArgument>& args, std::string& errorString,
  MessageType& status)
{
  errorString.clear();

  // handle empty invocation
  if (args.empty()) {
    return false;
  }

  // store the reduced args in this vector
  cmArgumentList newArgs(args.begin(), args.end());

  // now loop through the arguments and see if we can reduce any of them
  // we do this multiple times. Once for each level of precedence
  // parens
  using handlerFn_t = bool (cmConditionEvaluator::*)(
    cmArgumentList&, std::string&, MessageType&);
  const std::array<handlerFn_t, 5> handlers = { {
    &cmConditionEvaluator::HandleLevel0, // parenthesis
    &cmConditionEvaluator::HandleLevel1, // predicates
    &cmConditionEvaluator::HandleLevel2, // binary ops
    &cmConditionEvaluator::HandleLevel3, // NOT
    &cmConditionEvaluator::HandleLevel4  // AND OR
  } };
  for (auto fn : handlers) {
    // Call the reducer 'till there is anything to reduce...
    // (i.e., if after an iteration the size becomes smaller)
    auto levelResult = true;
    for (auto beginSize = newArgs.size();
         (levelResult = (this->*fn)(newArgs, errorString, status)) &&
         newArgs.size() < beginSize;
         beginSize = newArgs.size()) {
    }

    if (!levelResult) {
      // NOTE `errorString` supposed to be set already
      return false;
    }
  }

  // now at the end there should only be one argument left
  if (newArgs.size() != 1) {
    errorString = "Unknown arguments specified";
    status = MessageType::FATAL_ERROR;
    return false;
  }

  return this->GetBooleanValueWithAutoDereference(newArgs.front(), errorString,
                                                  status, true);
}